

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtablewidget.cpp
# Opt level: O3

void QTableWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  undefined4 uVar4;
  QTableModel *pQVar5;
  ScrollHint hint;
  int iVar6;
  QTableWidgetItem *item;
  long in_FS_OFFSET;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  undefined8 uStack_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    break;
  case ReadProperty:
    puVar1 = (undefined4 *)*_a;
    if (_id == 1) {
      local_28 = (void *)0xffffffffffffffff;
      local_20 = (undefined8 *)0x0;
      uStack_18 = 0;
      uVar4 = (**(code **)(**(long **)(*(long *)(_o + 8) + 0x2f8) + 0x80))();
    }
    else {
      if (_id != 0) goto switchD_0059773e_caseD_3;
      local_28 = (void *)0xffffffffffffffff;
      local_20 = (undefined8 *)0x0;
      uStack_18 = 0;
      uVar4 = (**(code **)(**(long **)(*(long *)(_o + 8) + 0x2f8) + 0x78))();
    }
    *puVar1 = uVar4;
    goto switchD_0059773e_caseD_3;
  case WriteProperty:
    if (_id == 1) {
      iVar6 = **_a;
      pQVar5 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QTableModel::setColumnCount(pQVar5,iVar6);
        return;
      }
      goto LAB_00597df1;
    }
    if (_id == 0) {
      iVar6 = **_a;
      pQVar5 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QTableModel::setRowCount(pQVar5,iVar6);
        return;
      }
      goto LAB_00597df1;
    }
  default:
    goto switchD_0059773e_caseD_3;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == itemPressed && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == itemClicked && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == itemDoubleClicked && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == itemActivated && lVar3 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar2 == itemEntered && lVar3 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar2 == itemChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar2 == currentItemChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (pcVar2 == itemSelectionChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 7;
    }
    else if (pcVar2 == cellPressed && lVar3 == 0) {
      *(undefined4 *)*_a = 8;
    }
    else if (pcVar2 == cellClicked && lVar3 == 0) {
      *(undefined4 *)*_a = 9;
    }
    else if (pcVar2 == cellDoubleClicked && lVar3 == 0) {
      *(undefined4 *)*_a = 10;
    }
    else if (pcVar2 == cellActivated && lVar3 == 0) {
      *(undefined4 *)*_a = 0xb;
    }
    else if (pcVar2 == cellEntered && lVar3 == 0) {
      *(undefined4 *)*_a = 0xc;
    }
    else if (pcVar2 == cellChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0xd;
    }
    else if (pcVar2 == currentCellChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0xe;
    }
    goto switchD_0059773e_caseD_3;
  }
  switch(_id) {
  case 0:
    local_30 = *_a[1];
    iVar6 = 0;
    goto LAB_00597b81;
  case 1:
    local_30 = *_a[1];
    iVar6 = 1;
    goto LAB_00597b81;
  case 2:
    local_30 = *_a[1];
    iVar6 = 2;
    goto LAB_00597b81;
  case 3:
    local_30 = *_a[1];
    iVar6 = 3;
    goto LAB_00597b81;
  case 4:
    local_30 = *_a[1];
    iVar6 = 4;
    goto LAB_00597b81;
  case 5:
    local_30 = *_a[1];
    iVar6 = 5;
LAB_00597b81:
    local_20 = &local_30;
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar6,&local_28);
switchD_0059773e_caseD_3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      currentItemChanged((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QMetaObject::activate(_o,&staticMetaObject,7,(void **)0x0);
      return;
    }
    break;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      cellPressed((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      cellClicked((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      cellDoubleClicked((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      cellActivated((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0xc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      cellEntered((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0xd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      cellChanged((QTableWidget *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0xe:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      currentCellChanged((QTableWidget *)_o,*_a[1],*_a[2],*_a[3],*_a[4]);
      return;
    }
    break;
  case 0xf:
    item = *_a[1];
    hint = *_a[2];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
LAB_00597a7b:
      scrollToItem((QTableWidget *)_o,item,hint);
      return;
    }
    break;
  case 0x10:
    item = *_a[1];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      hint = EnsureVisible;
      goto LAB_00597a7b;
    }
    break;
  case 0x11:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      insertRow((QTableWidget *)_o,*_a[1]);
      return;
    }
    break;
  case 0x12:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      insertColumn((QTableWidget *)_o,*_a[1]);
      return;
    }
    break;
  case 0x13:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      removeRow((QTableWidget *)_o,*_a[1]);
      return;
    }
    break;
  case 0x14:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      removeColumn((QTableWidget *)_o,*_a[1]);
      return;
    }
    break;
  case 0x15:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      clear((QTableWidget *)_o);
      return;
    }
    break;
  case 0x16:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      clearContents((QTableWidget *)_o);
      return;
    }
    break;
  default:
    goto switchD_0059773e_caseD_3;
  }
LAB_00597df1:
  __stack_chk_fail();
}

Assistant:

void QTableWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTableWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemPressed((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 1: _t->itemClicked((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 2: _t->itemDoubleClicked((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 3: _t->itemActivated((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 4: _t->itemEntered((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 5: _t->itemChanged((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 6: _t->currentItemChanged((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[2]))); break;
        case 7: _t->itemSelectionChanged(); break;
        case 8: _t->cellPressed((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 9: _t->cellClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 10: _t->cellDoubleClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 11: _t->cellActivated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 12: _t->cellEntered((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 13: _t->cellChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 14: _t->currentCellChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4]))); break;
        case 15: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTableWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemView::ScrollHint>>(_a[2]))); break;
        case 16: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTableWidgetItem*>>(_a[1]))); break;
        case 17: _t->insertRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 18: _t->insertColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 19: _t->removeRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 20: _t->removeColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 21: _t->clear(); break;
        case 22: _t->clearContents(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemPressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemClicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemDoubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemActivated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemEntered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * , QTableWidgetItem * )>(_a, &QTableWidget::currentItemChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)()>(_a, &QTableWidget::itemSelectionChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellPressed, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellClicked, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellDoubleClicked, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellActivated, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellEntered, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellChanged, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int , int , int )>(_a, &QTableWidget::currentCellChanged, 14))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->rowCount(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->columnCount(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setRowCount(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setColumnCount(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}